

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O1

void __thiscall
tcu::TestPackageRegistry::registerPackage
          (TestPackageRegistry *this,char *name,TestPackageCreateFunc createFunc)

{
  PackageInfo *pPVar1;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  PackageInfo *local_30;
  
  pPVar1 = (PackageInfo *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pPVar1,local_50,local_48 + (long)local_50);
  pPVar1->createFunc = createFunc;
  local_30 = pPVar1;
  std::
  vector<tcu::TestPackageRegistry::PackageInfo*,std::allocator<tcu::TestPackageRegistry::PackageInfo*>>
  ::emplace_back<tcu::TestPackageRegistry::PackageInfo*>
            ((vector<tcu::TestPackageRegistry::PackageInfo*,std::allocator<tcu::TestPackageRegistry::PackageInfo*>>
              *)this,&local_30);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void TestPackageRegistry::registerPackage (const char* name, TestPackageCreateFunc createFunc)
{
	DE_ASSERT(getPackageInfoByName(name) == DE_NULL);
	m_packageInfos.push_back(new PackageInfo(name, createFunc));
}